

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

bool __thiscall ImFontAtlas::Build(ImFontAtlas *this)

{
  ImVector<ImFont::Glyph> *this_00;
  int *piVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  stbtt__point sVar4;
  stbtt__point sVar5;
  undefined4 uVar6;
  stbtt_uint8 sVar7;
  byte bVar8;
  undefined2 uVar9;
  int iVar10;
  undefined4 uVar11;
  ImFontAtlas *pIVar12;
  stbtt_uint8 *data_00;
  stbtt__active_edge *psVar13;
  undefined8 *puVar14;
  stbrp_node *psVar15;
  short sVar16;
  short sVar17;
  undefined1 auVar18 [15];
  undefined1 auVar19 [14];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [14];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  unkuint9 Var28;
  undefined1 auVar29 [11];
  undefined1 auVar30 [13];
  undefined1 auVar31 [14];
  unkbyte10 Var32;
  undefined1 auVar33 [12];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [14];
  undefined1 auVar37 [12];
  uint6 uVar38;
  ImGuiContext *pIVar39;
  undefined4 uVar40;
  stbtt_uint32 sVar41;
  stbtt_uint32 sVar42;
  stbtt_uint32 sVar43;
  stbtt_uint32 sVar44;
  stbtt_uint32 sVar45;
  stbtt_uint32 sVar46;
  stbtt_uint32 sVar47;
  stbtt_uint32 sVar48;
  int iVar49;
  int iVar50;
  int iVar51;
  uint uVar52;
  uint uVar53;
  uint uVar54;
  ImWchar *in_range;
  value_type *pvVar55;
  ImWchar *pIVar56;
  stbrp_context *context;
  stbrp_node *psVar57;
  value_type *pvVar58;
  uchar *puVar59;
  uint *puVar60;
  ulong uVar61;
  void *pvVar62;
  stbtt__edge *p_00;
  stbtt__edge *psVar63;
  float *scanline;
  undefined8 *puVar64;
  long *plVar65;
  Glyph *pGVar66;
  value_type *pvVar67;
  ushort uVar68;
  uint uVar69;
  stbtt__active_edge *psVar70;
  stbtt__active_edge *psVar71;
  float *pfVar72;
  ulong uVar73;
  long lVar74;
  ulong uVar75;
  float *pfVar76;
  long lVar77;
  float fVar78;
  ulong uVar79;
  size_t __n;
  long lVar80;
  stbtt_uint32 encoding_record;
  uint uVar81;
  int iVar82;
  uchar *puVar83;
  int i_1;
  int iVar84;
  long lVar85;
  stbtt__edge *psVar86;
  long lVar87;
  long lVar88;
  ulong uVar89;
  uchar *puVar90;
  ulong uVar91;
  ulong uVar92;
  byte *pbVar93;
  ImFont *pIVar94;
  int iVar95;
  int iVar96;
  int iVar97;
  long lVar98;
  int char_idx;
  void *p;
  stbtt_fontinfo *psVar99;
  long lVar100;
  stbtt__active_edge *psVar101;
  byte *pbVar102;
  long lVar103;
  size_t __n_00;
  long lVar104;
  ulong uVar105;
  stbtt_uint8 *data;
  short *psVar106;
  bool bVar107;
  byte bVar108;
  char cVar114;
  char cVar115;
  float sum;
  float fVar109;
  float fVar110;
  float fVar111;
  char cVar116;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  ushort uVar117;
  float fVar118;
  short sVar121;
  ushort uVar122;
  float fVar119;
  undefined1 auVar120 [16];
  ushort uVar125;
  ushort uVar127;
  undefined1 in_XMM2 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar126 [12];
  float in_XMM3_Da;
  float fVar128;
  undefined1 auVar129 [16];
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  stbtt__point *local_4b0;
  int local_47c;
  int y0;
  float local_430;
  int ix0;
  undefined1 local_428 [12];
  float fStack_41c;
  ImVector<ImFontConfig> *local_410;
  undefined8 *local_408;
  value_type *local_400;
  float y0_2;
  float fStack_3f4;
  undefined8 uStack_3f0;
  void *local_3e0;
  stbtt_fontinfo *local_3d8;
  long local_3d0;
  long local_3c8;
  ulong local_3c0;
  uchar *local_3b8;
  uint local_3ac;
  undefined1 local_3a8 [16];
  void *local_398;
  stbtt__edge *local_390;
  int x1;
  undefined4 uStack_384;
  stbtt_pack_context local_380;
  void *local_348;
  void *local_340;
  ulong local_338;
  ulong local_330;
  ulong local_328;
  uint local_320;
  uint local_31c;
  int local_318;
  int y0_1;
  int x0_1;
  int iy0;
  ImVector<stbrp_rect> extra_rects;
  int local_270;
  int x1_1;
  ulong local_268;
  undefined8 uStack_260;
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  int x0;
  undefined4 uStack_234;
  int local_230;
  
  if ((this->ConfigData).Size < 1) {
    __assert_fail("ConfigData.Size > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui_draw.cpp"
                  ,0x4e1,"bool ImFontAtlas::Build()");
  }
  this->TexID = (void *)0x0;
  this->TexWidth = 0;
  this->TexHeight = 0;
  local_410 = &this->ConfigData;
  (this->TexUvWhitePixel).x = 0.0;
  (this->TexUvWhitePixel).y = 0.0;
  ClearTexData(this);
  pIVar39 = GImGui;
  iVar84 = (this->ConfigData).Size;
  piVar1 = &(GImGui->IO).MetricsAllocs;
  *piVar1 = *piVar1 + 1;
  local_3e0 = (*(pIVar39->IO).MemAllocFn)((long)iVar84 * 0x50);
  iVar84 = 0;
  iVar95 = 0;
  for (lVar103 = 0; iVar10 = local_410->Size, lVar103 < iVar10; lVar103 = lVar103 + 1) {
    pvVar55 = ImVector<ImFontConfig>::operator[](local_410,(int)lVar103);
    if ((pvVar55->DstFont == (ImFont *)0x0) ||
       (pIVar12 = pvVar55->DstFont->ContainerAtlas, pIVar12 != this && pIVar12 != (ImFontAtlas *)0x0
       )) {
      __assert_fail("cfg.DstFont && (!cfg.DstFont->IsLoaded() || cfg.DstFont->ContainerAtlas == this)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui_draw.cpp"
                    ,0x4f9,"bool ImFontAtlas::Build()");
    }
    data_00 = (stbtt_uint8 *)pvVar55->FontData;
    iVar49 = pvVar55->FontNo;
    sVar7 = *data_00;
    if (sVar7 == '\0') {
      if (data_00[1] != '\x01') goto LAB_00150421;
LAB_0014dd6e:
      if ((data_00[2] != '\0') || (data_00[3] != '\0')) goto LAB_00150421;
LAB_0014ddb2:
      sVar48 = -(uint)(iVar49 != 0);
    }
    else {
      if (sVar7 != 't') {
        if (sVar7 != 'O') {
          if ((sVar7 != '1') || (data_00[1] != '\0')) goto LAB_00150421;
          goto LAB_0014dd6e;
        }
        if (((data_00[1] != 'T') || (data_00[2] != 'T')) || (data_00[3] != 'O')) goto LAB_00150421;
        goto LAB_0014ddb2;
      }
      if (data_00[1] != 't') {
        if (((data_00[1] != 'y') || (data_00[2] != 'p')) || (data_00[3] != '1')) goto LAB_00150421;
        goto LAB_0014ddb2;
      }
      if (((data_00[2] != 'c') || (data_00[3] != 'f')) ||
         (((sVar48 = ttULONG(data_00 + 4), sVar48 != 0x20000 && (sVar48 != 0x10000)) ||
          (uVar81 = *(uint *)(data_00 + 8),
          (int)(uVar81 >> 0x18 | (uVar81 & 0xff0000) >> 8 | (uVar81 & 0xff00) << 8 | uVar81 << 0x18)
          <= iVar49)))) goto LAB_00150421;
      sVar48 = ttULONG(data_00 + (long)iVar49 * 4 + 0xc);
    }
    pvVar62 = local_3e0;
    if ((int)sVar48 < 0) {
LAB_00150421:
      __assert_fail("font_offset >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui_draw.cpp"
                    ,0x4fb,"bool ImFontAtlas::Build()");
    }
    *(stbtt_uint8 **)((long)local_3e0 + lVar103 * 0x50 + 8) = data_00;
    *(stbtt_uint32 *)((long)local_3e0 + lVar103 * 0x50 + 0x10) = sVar48;
    sVar41 = stbtt__find_table(data_00,sVar48,"cmap");
    sVar42 = stbtt__find_table(data_00,sVar48,"loca");
    *(stbtt_uint32 *)((long)pvVar62 + lVar103 * 0x50 + 0x18) = sVar42;
    sVar43 = stbtt__find_table(data_00,sVar48,"head");
    *(stbtt_uint32 *)((long)pvVar62 + lVar103 * 0x50 + 0x1c) = sVar43;
    sVar44 = stbtt__find_table(data_00,sVar48,"glyf");
    *(stbtt_uint32 *)((long)pvVar62 + lVar103 * 0x50 + 0x20) = sVar44;
    sVar45 = stbtt__find_table(data_00,sVar48,"hhea");
    *(stbtt_uint32 *)((long)pvVar62 + lVar103 * 0x50 + 0x24) = sVar45;
    sVar46 = stbtt__find_table(data_00,sVar48,"hmtx");
    *(stbtt_uint32 *)((long)pvVar62 + lVar103 * 0x50 + 0x28) = sVar46;
    sVar47 = stbtt__find_table(data_00,sVar48,"kern");
    *(stbtt_uint32 *)((long)pvVar62 + lVar103 * 0x50 + 0x2c) = sVar47;
    if (((((sVar41 == 0) || (sVar42 == 0)) || (sVar43 == 0)) || ((sVar44 == 0 || (sVar45 == 0)))) ||
       (sVar46 == 0)) goto LAB_00150323;
    sVar48 = stbtt__find_table(data_00,sVar48,"maxp");
    if (sVar48 == 0) {
      uVar81 = 0xffff;
    }
    else {
      uVar81 = (uint)(ushort)(*(ushort *)(data_00 + (ulong)sVar48 + 4) << 8 |
                             *(ushort *)(data_00 + (ulong)sVar48 + 4) >> 8);
    }
    *(uint *)((long)pvVar62 + lVar103 * 0x50 + 0x14) = uVar81;
    uVar68 = *(ushort *)(data_00 + (ulong)sVar41 + 2);
    *(undefined4 *)((long)pvVar62 + lVar103 * 0x50 + 0x30) = 0;
    uVar79 = (ulong)(ushort)(uVar68 << 8 | uVar68 >> 8);
    uVar81 = sVar41 + 4;
    iVar49 = 0;
    while( true ) {
      bVar107 = uVar79 == 0;
      uVar79 = uVar79 - 1;
      if (bVar107) break;
      uVar68 = *(ushort *)(data_00 + uVar81) << 8 | *(ushort *)(data_00 + uVar81) >> 8;
      if ((uVar68 == 0) ||
         ((uVar68 == 3 &&
          ((uVar68 = *(ushort *)(data_00 + (ulong)uVar81 + 2) << 8 |
                     *(ushort *)(data_00 + (ulong)uVar81 + 2) >> 8, uVar68 == 10 || (uVar68 == 1))))
         )) {
        sVar48 = ttULONG(data_00 + (ulong)uVar81 + 4);
        iVar49 = sVar48 + sVar41;
        *(int *)((long)pvVar62 + lVar103 * 0x50 + 0x30) = iVar49;
      }
      uVar81 = uVar81 + 8;
    }
    if (iVar49 == 0) goto LAB_00150323;
    *(uint *)((long)pvVar62 + lVar103 * 0x50 + 0x34) =
         (uint)(ushort)(*(ushort *)(data_00 + (long)(int)sVar43 + 0x32) << 8 |
                       *(ushort *)(data_00 + (long)(int)sVar43 + 0x32) >> 8);
    pIVar56 = pvVar55->GlyphRanges;
    if (pIVar56 == (ushort *)0x0) {
      pIVar56 = GetGlyphRangesDefault::ranges;
      pvVar55->GlyphRanges = GetGlyphRangesDefault::ranges;
    }
    for (; (*pIVar56 != 0 && (pIVar56[1] != 0)); pIVar56 = pIVar56 + 2) {
      iVar95 = (iVar95 - (uint)*pIVar56) + (uint)pIVar56[1] + 1;
      iVar84 = iVar84 + 1;
    }
  }
  uVar81 = this->TexDesiredWidth;
  if ((((int)uVar81 < 1) && (uVar81 = 0x1000, iVar95 < 0xfa1)) && (uVar81 = 0x800, iVar95 < 0x7d1))
  {
    uVar81 = (uint)(1000 < iVar95) * 0x200 + 0x200;
  }
  this->TexWidth = uVar81;
  this->TexHeight = 0;
  pIVar39 = GImGui;
  piVar1 = &(GImGui->IO).MetricsAllocs;
  *piVar1 = *piVar1 + 1;
  context = (stbrp_context *)(*(pIVar39->IO).MemAllocFn)(0x48);
  pIVar39 = GImGui;
  uVar52 = uVar81 - 1;
  piVar1 = &(GImGui->IO).MetricsAllocs;
  *piVar1 = *piVar1 + 1;
  psVar57 = (stbrp_node *)(*(pIVar39->IO).MemAllocFn)((ulong)uVar52 << 4);
  pIVar39 = GImGui;
  if ((context == (stbrp_context *)0x0) || (psVar57 == (stbrp_node *)0x0)) {
    if (context != (stbrp_context *)0x0) {
      piVar1 = &(GImGui->IO).MetricsAllocs;
      *piVar1 = *piVar1 + -1;
      (*(pIVar39->IO).MemFreeFn)(context);
    }
    pIVar39 = GImGui;
    if (psVar57 != (stbrp_node *)0x0) {
      piVar1 = &(GImGui->IO).MetricsAllocs;
      *piVar1 = *piVar1 + -1;
      (*(pIVar39->IO).MemFreeFn)(psVar57);
    }
  }
  else {
    local_380.user_allocator_context = (void *)0x0;
    local_380.height = 0x8000;
    local_380.pixels = (uchar *)0x0;
    local_380.padding = 1;
    local_380.h_oversample = 1;
    local_380.v_oversample = 1;
    local_380.pack_info = context;
    local_380.width = uVar81;
    local_380.stride_in_bytes = uVar81;
    local_380.nodes = psVar57;
    if (0x10000 < uVar81) {
      __assert_fail("width <= 0xffff && height <= 0xffff",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/stb_rect_pack.h"
                    ,0xf2,"void stbrp_init_target(stbrp_context *, int, int, stbrp_node *, int)");
    }
    uVar81 = uVar81 - 2;
    uVar75 = 0;
    psVar15 = psVar57;
    uVar79 = uVar75;
    if (0 < (int)uVar81) {
      uVar75 = (ulong)uVar81;
      uVar79 = uVar75;
    }
    while( true ) {
      bVar107 = uVar75 == 0;
      uVar75 = uVar75 - 1;
      if (bVar107) break;
      psVar15->next = psVar15 + 1;
      psVar15 = psVar15 + 1;
    }
    psVar57[uVar79].next = (stbrp_node *)0x0;
    context->init_mode = 1;
    context->heuristic = 0;
    context->free_head = psVar57;
    context->active_head = context->extra;
    context->width = uVar52;
    context->height = 0x7fff;
    context->num_nodes = uVar52;
    context->align = (int)(uVar81 + uVar52) / (int)uVar52;
    context->extra[0].x = 0;
    context->extra[0].y = 0;
    context->extra[0].next = context->extra + 1;
    context->extra[1].x = (stbrp_coord)uVar52;
    context->extra[1].y = 0xffff;
    context->extra[1].next = (stbrp_node *)0x0;
  }
  extra_rects.Size = 0;
  extra_rects.Capacity = 0;
  extra_rects.Data = (stbrp_rect *)0x0;
  RenderCustomTexData(this,0,&extra_rects);
  local_380.h_oversample = 1;
  local_380.v_oversample = 1;
  pvVar58 = ImVector<stbrp_rect>::operator[](&extra_rects,0);
  stbrp_pack_rects(context,pvVar58,extra_rects.Size);
  for (iVar49 = 0; pIVar39 = GImGui, iVar49 < extra_rects.Size; iVar49 = iVar49 + 1) {
    pvVar58 = ImVector<stbrp_rect>::operator[](&extra_rects,iVar49);
    if (pvVar58->was_packed != 0) {
      iVar82 = this->TexHeight;
      pvVar58 = ImVector<stbrp_rect>::operator[](&extra_rects,iVar49);
      uVar68 = pvVar58->y;
      pvVar58 = ImVector<stbrp_rect>::operator[](&extra_rects,iVar49);
      iVar50 = (uint)pvVar58->h + (uint)uVar68;
      if (iVar50 < iVar82) {
        iVar50 = iVar82;
      }
      this->TexHeight = iVar50;
    }
  }
  __n_00 = (long)iVar95 * 0x1c;
  piVar1 = &(GImGui->IO).MetricsAllocs;
  *piVar1 = *piVar1 + 1;
  local_398 = (*(pIVar39->IO).MemAllocFn)(__n_00);
  pIVar39 = GImGui;
  __n = (long)iVar95 << 4;
  piVar1 = &(GImGui->IO).MetricsAllocs;
  *piVar1 = *piVar1 + 1;
  local_340 = (*(pIVar39->IO).MemAllocFn)(__n);
  pIVar39 = GImGui;
  piVar1 = &(GImGui->IO).MetricsAllocs;
  *piVar1 = *piVar1 + 1;
  local_348 = (*(pIVar39->IO).MemAllocFn)((long)iVar84 * 0x28);
  memset(local_398,0,__n_00);
  memset(local_340,0,__n);
  memset(local_348,0,(long)iVar84 * 0x28);
  uVar79 = 0;
  iVar49 = 0;
  iVar82 = 0;
  lVar104 = 0;
  while (lVar104 < local_410->Size) {
    pvVar55 = ImVector<ImFontConfig>::operator[](local_410,(int)lVar104);
    psVar99 = (stbtt_fontinfo *)(lVar104 * 0x50 + (long)local_3e0);
    pIVar56 = pvVar55->GlyphRanges;
    lVar98 = 0;
    local_408 = (undefined8 *)0x0;
    while ((pIVar56[lVar98 * 2] != 0 && (pIVar56[lVar98 * 2 + 1] != 0))) {
      local_408 = (undefined8 *)
                  (ulong)(((int)local_408 - (uint)pIVar56[lVar98 * 2]) +
                          (uint)pIVar56[lVar98 * 2 + 1] + 1);
      lVar98 = lVar98 + 1;
    }
    local_3c0 = uVar79 & 0xffffffff;
    pfVar76 = (float *)(local_3c0 * 0x28 + (long)local_348);
    psVar99[1].data = (uchar *)pfVar76;
    psVar99[1].fontstart = (int)lVar98;
    fVar109 = pvVar55->SizePixels;
    for (lVar85 = 0; lVar98 != lVar85; lVar85 = lVar85 + 1) {
      *pfVar76 = fVar109;
      uVar68 = pIVar56[lVar85 * 2];
      pfVar76[1] = (float)(uint)uVar68;
      iVar50 = (uint)pIVar56[lVar85 * 2 + 1] - (uint)uVar68;
      pfVar76[4] = (float)(iVar50 + 1);
      *(void **)(pfVar76 + 6) = (void *)((long)iVar82 * 0x1c + (long)local_398);
      iVar82 = iVar50 + iVar82 + 1;
      pfVar76 = pfVar76 + 10;
    }
    psVar99[1].userdata = (void *)((long)iVar49 * 0x10 + (long)local_340);
    local_3c8 = lVar104;
    stbtt_PackSetOversampling(&local_380,pvVar55->OversampleH,pvVar55->OversampleV);
    uVar75 = 0;
    uVar79 = (ulong)(uint)psVar99[1].fontstart;
    if (psVar99[1].fontstart < 1) {
      uVar79 = uVar75;
    }
    uVar61 = local_380._32_8_ & 0xffffffff;
    local_400 = (value_type *)CONCAT44(local_400._4_4_,(float)uVar61);
    local_3b8 = (uchar *)((ulong)local_380._32_8_ >> 0x20);
    fVar109 = (float)(long)local_3b8;
    sVar16 = (short)local_380.v_oversample;
    sVar17 = (short)local_380.padding;
    _y0_2 = (long)psVar99[1].userdata + 6;
    uVar105 = 0;
    local_3a8._0_8_ = psVar99[1].data;
    puVar59 = psVar99[1].data;
    while (iVar50 = (int)uVar105, uVar75 != uVar79) {
      local_428._0_8_ = uVar75;
      lVar104 = uVar75 * 0x28;
      fVar110 = *(float *)(puVar59 + lVar104);
      if (fVar110 <= 0.0) {
        fVar110 = -fVar110 /
                  (float)(ushort)(*(ushort *)(psVar99->data + (long)psVar99->head + 0x12) << 8 |
                                 *(ushort *)(psVar99->data + (long)psVar99->head + 0x12) >> 8);
      }
      else {
        fVar110 = stbtt_ScaleForPixelHeight(psVar99,fVar110);
      }
      puVar59[lVar104 + 0x20] = (uchar)uVar61;
      puVar59[lVar104 + 0x21] = (uchar)local_3b8;
      fVar118 = fVar110 * local_400._0_4_;
      psVar106 = (short *)((long)iVar50 * 0x10 + _y0_2);
      for (lVar85 = 0; lVar85 < *(int *)(puVar59 + lVar104 + 0x10); lVar85 = lVar85 + 1) {
        if (*(long *)(puVar59 + lVar104 + 8) == 0) {
          iVar51 = *(int *)(puVar59 + lVar104 + 4) + (int)lVar85;
        }
        else {
          iVar51 = *(int *)(*(long *)(puVar59 + lVar104 + 8) + lVar85 * 4);
        }
        iVar51 = stbtt_FindGlyphIndex(psVar99,iVar51);
        stbtt_GetGlyphBitmapBoxSubpixel
                  (psVar99,iVar51,fVar118,fVar110 * fVar109,in_XMM2._0_4_,in_XMM3_Da,&x0,&y0,&x1,
                   &ix0);
        psVar106[-1] = (((short)x1 + (short)uVar61) - (short)_x0) + sVar17 + -1;
        *psVar106 = ~(ushort)_y0 + (short)ix0 + sVar16 + sVar17;
        psVar106 = psVar106 + 8;
      }
      uVar105 = (ulong)(uint)(iVar50 + (int)lVar85);
      puVar59 = (uchar *)local_3a8._0_8_;
      uVar75 = local_428._0_8_ + 1;
    }
    stbrp_pack_rects((stbrp_context *)local_380.pack_info,(stbrp_rect *)psVar99[1].userdata,iVar50);
    uVar79 = local_3c0 + lVar98;
    iVar49 = (int)local_408 + iVar49;
    iVar51 = this->TexHeight;
    if (iVar50 < 1) {
      uVar105 = 0;
    }
    for (lVar104 = 0; uVar105 * 0x10 != lVar104; lVar104 = lVar104 + 0x10) {
      pvVar62 = psVar99[1].userdata;
      if (*(int *)((long)pvVar62 + lVar104 + 0xc) != 0) {
        iVar50 = (uint)*(ushort *)((long)pvVar62 + lVar104 + 6) +
                 (uint)*(ushort *)((long)pvVar62 + lVar104 + 10);
        if (iVar51 <= iVar50) {
          iVar51 = iVar50;
        }
        this->TexHeight = iVar51;
      }
    }
    lVar104 = local_3c8 + 1;
  }
  if (iVar49 != iVar95) {
    __assert_fail("buf_rects_n == total_glyph_count",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui_draw.cpp"
                  ,0x54b,"bool ImFontAtlas::Build()");
  }
  if (iVar82 != iVar95) {
    __assert_fail("buf_packedchars_n == total_glyph_count",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui_draw.cpp"
                  ,0x54c,"bool ImFontAtlas::Build()");
  }
  if ((int)uVar79 != iVar84) {
    __assert_fail("buf_ranges_n == total_glyph_range_count",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui_draw.cpp"
                  ,0x54d,"bool ImFontAtlas::Build()");
  }
  uVar81 = this->TexHeight - 1;
  uVar81 = (int)uVar81 >> 1 | uVar81;
  uVar81 = (int)uVar81 >> 2 | uVar81;
  uVar81 = (int)uVar81 >> 4 | uVar81;
  uVar81 = (int)uVar81 >> 8 | uVar81;
  lVar104 = (long)(int)((int)uVar81 >> 0x10 | uVar81) + 1;
  this->TexHeight = (int)lVar104;
  pIVar39 = GImGui;
  iVar84 = this->TexWidth;
  piVar1 = &(GImGui->IO).MetricsAllocs;
  *piVar1 = *piVar1 + 1;
  puVar59 = (uchar *)(*(pIVar39->IO).MemAllocFn)(iVar84 * lVar104);
  this->TexPixelsAlpha8 = puVar59;
  memset(puVar59,0,(long)this->TexHeight * (long)this->TexWidth);
  local_380.pixels = this->TexPixelsAlpha8;
  local_380.height = this->TexHeight;
  for (lVar104 = 0; lVar104 < local_410->Size; lVar104 = lVar104 + 1) {
    pvVar55 = ImVector<ImFontConfig>::operator[](local_410,(int)lVar104);
    pvVar62 = local_3e0;
    lVar80 = lVar104 * 0x50;
    local_3d8 = (stbtt_fontinfo *)((long)local_3e0 + lVar80);
    stbtt_PackSetOversampling(&local_380,pvVar55->OversampleH,pvVar55->OversampleV);
    lVar98 = *(long *)((long)pvVar62 + lVar80 + 0x38);
    lVar85 = *(long *)((long)pvVar62 + lVar80 + 0x40);
    uVar81 = *(uint *)((long)pvVar62 + lVar80 + 0x48);
    local_268._0_4_ = local_380.h_oversample;
    local_268._4_4_ = local_380.v_oversample;
    uStack_260 = 0;
    if ((int)uVar81 < 1) {
      uVar81 = 0;
    }
    lVar80 = 0;
    for (uVar79 = 0; uVar79 != uVar81; uVar79 = uVar79 + 1) {
      fVar109 = *(float *)(lVar85 + uVar79 * 0x28);
      if (fVar109 <= 0.0) {
        fVar109 = -fVar109 /
                  (float)(ushort)(*(ushort *)(local_3d8->data + (long)local_3d8->head + 0x12) << 8 |
                                 *(ushort *)(local_3d8->data + (long)local_3d8->head + 0x12) >> 8);
      }
      else {
        fVar109 = stbtt_ScaleForPixelHeight(local_3d8,fVar109);
      }
      lVar77 = uVar79 * 0x28 + lVar85;
      uVar75 = *(ulong *)(lVar77 + 0x20);
      auVar18._8_6_ = 0;
      auVar18._0_8_ = uVar75;
      auVar18[0xe] = (char)(uVar75 >> 0x38);
      auVar20._8_4_ = 0;
      auVar20._0_8_ = uVar75;
      auVar20[0xc] = (char)(uVar75 >> 0x30);
      auVar20._13_2_ = auVar18._13_2_;
      auVar21._8_4_ = 0;
      auVar21._0_8_ = uVar75;
      auVar21._12_3_ = auVar20._12_3_;
      auVar22._8_2_ = 0;
      auVar22._0_8_ = uVar75;
      auVar22[10] = (char)(uVar75 >> 0x28);
      auVar22._11_4_ = auVar21._11_4_;
      auVar23._8_2_ = 0;
      auVar23._0_8_ = uVar75;
      auVar23._10_5_ = auVar22._10_5_;
      auVar25[8] = (char)(uVar75 >> 0x20);
      auVar25._0_8_ = uVar75;
      auVar25._9_6_ = auVar23._9_6_;
      auVar27._7_8_ = 0;
      auVar27._0_7_ = auVar25._8_7_;
      cVar116 = (char)(uVar75 >> 0x18);
      Var28 = CONCAT81(SUB158(auVar27 << 0x40,7),cVar116);
      auVar34._9_6_ = 0;
      auVar34._0_9_ = Var28;
      cVar115 = (char)(uVar75 >> 0x10);
      auVar29._1_10_ = SUB1510(auVar34 << 0x30,5);
      auVar29[0] = cVar115;
      auVar35._11_4_ = 0;
      auVar35._0_11_ = auVar29;
      cVar114 = (char)(uVar75 >> 8);
      auVar30._1_12_ = SUB1512(auVar35 << 0x20,3);
      auVar30[0] = cVar114;
      bVar108 = (byte)uVar75;
      uVar68 = CONCAT11(0,bVar108);
      auVar26._2_13_ = auVar30;
      auVar26._0_2_ = uVar68;
      uVar61 = (ulong)uVar68;
      sVar121 = 1 - auVar30._0_2_;
      sVar16 = -auVar29._0_2_;
      uVar117 = (ushort)Var28;
      sVar17 = -uVar117;
      auVar19._10_2_ = 0;
      auVar19._0_10_ = auVar26._0_10_;
      auVar19._12_2_ = uVar117;
      uVar38 = CONCAT42(auVar19._10_4_,auVar29._0_2_);
      auVar31._6_8_ = 0;
      auVar31._0_6_ = uVar38;
      Var32 = CONCAT82(SUB148(auVar31 << 0x40,6),auVar30._0_2_);
      auVar24._4_10_ = Var32;
      auVar24._0_4_ = CONCAT22(0,uVar68);
      local_380._32_8_ = auVar24._0_8_;
      auVar123._0_4_ = (float)CONCAT22(0,uVar68);
      uVar52 = (uint)Var32;
      auVar123._4_4_ = (float)uVar52;
      auVar123._8_4_ = (float)(int)uVar38;
      auVar123._12_4_ = (float)uVar117;
      local_258 = divps(_DAT_00182480,auVar123);
      auVar129[0] = -(bVar108 == 0);
      auVar129[1] = -(bVar108 == 0);
      auVar129[2] = -(bVar108 == 0);
      auVar129[3] = -(bVar108 == 0);
      auVar129[4] = -(cVar114 == '\0');
      auVar129[5] = -(cVar114 == '\0');
      auVar129[6] = -(cVar114 == '\0');
      auVar129[7] = -(cVar114 == '\0');
      auVar129[8] = -(cVar115 == '\0');
      auVar129[9] = -(cVar115 == '\0');
      auVar129[10] = -(cVar115 == '\0');
      auVar129[0xb] = -(cVar115 == '\0');
      auVar129[0xc] = -(cVar116 == '\0');
      auVar129[0xd] = -(cVar116 == '\0');
      auVar129[0xe] = -(cVar116 == '\0');
      auVar129[0xf] = -(cVar116 == '\0');
      Var32 = CONCAT64(CONCAT42(CONCAT22(sVar17,sVar17),sVar16),CONCAT22(sVar16,sVar17));
      auVar126._4_8_ = (long)((unkuint10)Var32 >> 0x10);
      auVar126._2_2_ = sVar121;
      auVar126._0_2_ = sVar121;
      auVar112._0_4_ = (float)(int)(short)(1 - uVar68);
      auVar112._4_4_ = (float)(auVar126._0_4_ >> 0x10);
      auVar112._8_4_ = (float)((int)((unkuint10)Var32 >> 0x10) >> 0x10);
      auVar112._12_4_ = (float)(int)sVar17;
      in_XMM2._0_4_ = auVar123._0_4_ + auVar123._0_4_;
      in_XMM2._4_4_ = auVar123._4_4_ + auVar123._4_4_;
      in_XMM2._8_4_ = auVar123._8_4_ + auVar123._8_4_;
      in_XMM2._12_4_ = auVar123._12_4_ + auVar123._12_4_;
      local_248 = divps(auVar112,in_XMM2);
      local_248 = ~auVar129 & local_248;
      lVar80 = (long)(int)lVar80;
      uVar75 = (ulong)uVar52;
      lVar74 = 0;
LAB_0014e8ba:
      psVar99 = local_3d8;
      fVar110 = 0.0;
      if (lVar74 < *(int *)(lVar77 + 0x10)) {
        if (*(int *)(lVar98 + 0xc + lVar80 * 0x10) != 0) {
          if (*(long *)(lVar77 + 8) == 0) {
            iVar84 = *(int *)(lVar77 + 4) + (int)lVar74;
          }
          else {
            iVar84 = *(int *)(*(long *)(lVar77 + 8) + lVar74 * 4);
          }
          lVar100 = lVar80 * 0x10 + lVar98;
          puVar60 = (uint *)(lVar74 * 0x1c + *(long *)(lVar77 + 0x18));
          iVar95 = stbtt_FindGlyphIndex(local_3d8,iVar84);
          uVar3 = *(undefined8 *)(lVar100 + 4);
          auVar112 = pshuflw(ZEXT416((uint)local_380.padding),ZEXT416((uint)local_380.padding),0);
          uVar117 = (short)uVar3 - auVar112._0_2_;
          uVar122 = (short)((ulong)uVar3 >> 0x10) - auVar112._2_2_;
          uVar125 = (short)((ulong)uVar3 >> 0x20) + auVar112._4_2_;
          uVar127 = (short)((ulong)uVar3 >> 0x30) + auVar112._6_2_;
          *(ulong *)(lVar100 + 4) = CONCAT44(CONCAT22(uVar127,uVar125),CONCAT22(uVar122,uVar117));
          puVar59 = psVar99->data;
          uVar68 = *(ushort *)(puVar59 + (long)psVar99->hhea + 0x22) << 8 |
                   *(ushort *)(puVar59 + (long)psVar99->hhea + 0x22) >> 8;
          iVar84 = psVar99->hmtx;
          lVar87 = (ulong)uVar68 * 4 + (long)iVar84 + -4;
          lVar88 = (ulong)uVar68 * 4 + (long)iVar84 + -3;
          if (iVar95 < (int)(uint)uVar68) {
            lVar87 = (long)(iVar95 * 4) + (long)iVar84;
            lVar88 = (long)(iVar95 * 4) + 1 + (long)iVar84;
          }
          local_31c = (uint)puVar59[lVar87];
          local_320 = (uint)puVar59[lVar88];
          fVar111 = (float)uVar61 * fVar109;
          fVar119 = (float)uVar75 * fVar109;
          fVar118 = fVar109;
          stbtt_GetGlyphBitmapBoxSubpixel
                    (psVar99,iVar95,fVar111,fVar119,fVar109,fVar110,&x0_1,&y0_1,&x1_1,&local_270);
          puVar59 = local_380.pixels;
          local_3ac = local_380.stride_in_bytes;
          uVar52 = stbtt_GetGlyphShape(psVar99,iVar95,(stbtt_vertex **)&x1);
          auVar112 = _local_428;
          local_428._0_4_ = (uint)uVar117 - (int)uVar61;
          local_428._4_4_ = 0;
          stack0xfffffffffffffbe0 = auVar112._8_8_;
          fVar78 = (float)(local_428._0_4_ + 1);
          stbtt_GetGlyphBitmapBoxSubpixel
                    (local_3d8,iVar95,fVar111,fVar119,fVar118,fVar110,&ix0,&iy0,(int *)0x0,
                     (int *)0x0);
          iVar84 = ix0;
          pIVar39 = GImGui;
          local_430 = fVar78;
          local_3d0 = lVar100;
          if ((fVar78 != 0.0) &&
             (uVar53 = ((uint)uVar122 - (int)uVar75) + 1, local_338 = (ulong)uVar53, uVar53 != 0)) {
            iVar95 = uVar127 * local_3ac;
            lVar87 = CONCAT44(uStack_384,x1);
            local_330 = (ulong)(uint)iy0;
            uVar61 = 0;
            uVar75 = (ulong)uVar52;
            if ((int)uVar52 < 1) {
              uVar75 = uVar61;
            }
            uVar105 = 0;
            for (; uVar75 * 10 - uVar61 != 0; uVar61 = uVar61 + 10) {
              uVar105 = (ulong)((int)uVar105 + (uint)(*(char *)(lVar87 + 8 + uVar61) == '\x01'));
            }
            if ((int)uVar105 != 0) {
              piVar1 = &(GImGui->IO).MetricsAllocs;
              *piVar1 = *piVar1 + 1;
              pvVar62 = (*(pIVar39->IO).MemAllocFn)(uVar105 * 4);
              if (pvVar62 != (void *)0x0) {
                fVar110 = fVar119;
                if (fVar111 <= fVar119) {
                  fVar110 = fVar111;
                }
                local_4b0 = (stbtt__point *)0x0;
                iVar49 = 0;
                iVar50 = 0;
                iVar82 = 0;
                do {
                  lVar100 = local_3d0;
                  pIVar39 = GImGui;
                  if (iVar50 == 1) {
                    piVar1 = &(GImGui->IO).MetricsAllocs;
                    *piVar1 = *piVar1 + 1;
                    local_4b0 = (stbtt__point *)(*(pIVar39->IO).MemAllocFn)((long)iVar82 << 3);
                    if (local_4b0 == (stbtt__point *)0x0) {
                      (*(GImGui->IO).MemFreeFn)((void *)0x0);
                      lVar100 = local_3d0;
                      pIVar39 = GImGui;
                      piVar1 = &(GImGui->IO).MetricsAllocs;
                      *piVar1 = *piVar1 + -1;
                      (*(pIVar39->IO).MemFreeFn)(pvVar62);
                      break;
                    }
                  }
                  else if (iVar50 == 2) goto LAB_0014ed0d;
                  _x0 = _x0 & 0xffffffff00000000;
                  fVar118 = 0.0;
                  fVar78 = 0.0;
                  uVar52 = 0xffffffff;
                  for (lVar88 = 0; iVar82 = x0, uVar75 * 10 - lVar88 != 0; lVar88 = lVar88 + 10) {
                    cVar114 = *(char *)(lVar87 + 8 + lVar88);
                    if (cVar114 == '\x03') {
                      stbtt__tesselate_curve
                                (local_4b0,&x0,fVar118,fVar78,
                                 (float)(int)*(short *)(lVar87 + 4 + lVar88),
                                 (float)(int)*(short *)(lVar87 + 6 + lVar88),
                                 (float)(int)*(short *)(lVar87 + lVar88),
                                 (float)(int)*(short *)(lVar87 + 2 + lVar88),
                                 (0.35 / fVar110) * (0.35 / fVar110),0);
                      auVar112 = pshuflw(ZEXT416(*(uint *)(lVar87 + lVar88)),
                                         ZEXT416(*(uint *)(lVar87 + lVar88)),0x60);
                      fVar118 = (float)(auVar112._0_4_ >> 0x10);
                      fVar78 = (float)(auVar112._4_4_ >> 0x10);
                    }
                    else if (cVar114 == '\x02') {
                      lVar100 = (long)x0;
                      auVar112 = pshuflw(ZEXT416(*(uint *)(lVar87 + lVar88)),
                                         ZEXT416(*(uint *)(lVar87 + lVar88)),0x60);
                      fVar118 = (float)(auVar112._0_4_ >> 0x10);
                      fVar78 = (float)(auVar112._4_4_ >> 0x10);
                      _x0 = CONCAT44(uStack_234,x0 + 1);
                      if (local_4b0 != (stbtt__point *)0x0) {
                        local_4b0[lVar100].x = fVar118;
                        local_4b0[lVar100].y = fVar78;
                      }
                    }
                    else if (cVar114 == '\x01') {
                      if (-1 < (int)uVar52) {
                        *(int *)((long)pvVar62 + (ulong)uVar52 * 4) = x0 - iVar49;
                      }
                      uVar52 = uVar52 + 1;
                      auVar112 = pshuflw(ZEXT416(*(uint *)(lVar87 + lVar88)),
                                         ZEXT416(*(uint *)(lVar87 + lVar88)),0x60);
                      fVar118 = (float)(auVar112._0_4_ >> 0x10);
                      fVar78 = (float)(auVar112._4_4_ >> 0x10);
                      _x0 = CONCAT44(uStack_234,x0 + 1);
                      iVar49 = iVar82;
                      if (local_4b0 != (stbtt__point *)0x0) {
                        local_4b0[iVar82].x = fVar118;
                        local_4b0[iVar82].y = fVar78;
                      }
                    }
                  }
                  *(int *)((long)pvVar62 + (long)(int)uVar52 * 4) = x0 - iVar49;
                  iVar50 = iVar50 + 1;
                } while( true );
              }
            }
          }
          goto LAB_0014f933;
        }
        goto LAB_0014fea4;
      }
    }
    local_380._32_8_ = local_268;
    local_3d8[1].userdata = (void *)0x0;
  }
  ImGui::MemFree(local_380.nodes);
  ImGui::MemFree(local_380.pack_info);
  ImGui::MemFree(local_340);
  uVar79 = 0;
  while (auVar126 = in_XMM2._4_12_, (long)uVar79 < (long)local_410->Size) {
    pvVar55 = ImVector<ImFontConfig>::operator[](local_410,(int)uVar79);
    pvVar62 = local_3e0;
    lVar98 = uVar79 * 0x50;
    psVar99 = (stbtt_fontinfo *)((long)local_3e0 + lVar98);
    pIVar94 = pvVar55->DstFont;
    fVar109 = pvVar55->SizePixels;
    local_3c0 = uVar79;
    fVar110 = stbtt_ScaleForPixelHeight(psVar99,fVar109);
    lVar104 = *(long *)((long)pvVar62 + lVar98 + 8);
    lVar98 = (long)*(int *)((long)pvVar62 + lVar98 + 0x24);
    uVar68 = *(ushort *)(lVar104 + 4 + lVar98);
    in_XMM2._0_4_ = (float)(int)(short)(uVar68 << 8 | uVar68 >> 8) * fVar110;
    in_XMM2._4_12_ = auVar126;
    bVar108 = pvVar55->MergeMode;
    local_3a8._0_8_ = pIVar94;
    if ((bool)bVar108 == false) {
      uVar68 = *(ushort *)(lVar104 + 6 + lVar98);
      pIVar94->ContainerAtlas = this;
      pIVar94->ConfigData = pvVar55;
      pIVar94->ConfigDataCount = 0;
      pIVar94->FontSize = fVar109;
      pIVar94->Ascent = in_XMM2._0_4_;
      pIVar94->Descent = fVar110 * (float)(int)(short)(uVar68 << 8 | uVar68 >> 8);
      ImVector<ImFont::Glyph>::resize(&pIVar94->Glyphs,0);
      bVar108 = pvVar55->MergeMode;
      in_XMM2 = ZEXT416((uint)in_XMM2._0_4_);
      pIVar94 = (ImFont *)local_3a8._0_8_;
    }
    pIVar94->ConfigDataCount = pIVar94->ConfigDataCount + 1;
    fVar109 = 0.0;
    if (((bVar108 & 1) != 0) && (pvVar55->MergeGlyphCenterV == true)) {
      in_XMM2._0_4_ = (in_XMM2._0_4_ - pIVar94->Ascent) * 0.5;
      fVar109 = in_XMM2._0_4_;
    }
    pIVar94->FallbackGlyph = (Glyph *)0x0;
    this_00 = &pIVar94->Glyphs;
    local_400 = pvVar55;
    for (lVar104 = 0; lVar104 < psVar99[1].fontstart; lVar104 = lVar104 + 1) {
      puVar59 = psVar99[1].data + lVar104 * 0x28;
      lVar85 = 0;
      local_3b8 = puVar59;
      for (lVar98 = 0; lVar98 < *(int *)(puVar59 + 0x10); lVar98 = lVar98 + 1) {
        lVar80 = *(long *)(puVar59 + 0x18);
        uVar68 = *(ushort *)(lVar80 + lVar85);
        if ((((uVar68 != 0) || (*(short *)(lVar80 + 4 + lVar85) != 0)) ||
            (*(short *)(lVar80 + 2 + lVar85) != 0)) || (*(short *)(lVar80 + 6 + lVar85) != 0)) {
          uVar11 = *(undefined4 *)(puVar59 + 4);
          lVar74 = lVar80;
          if (pvVar55->MergeMode == true) {
            pGVar66 = ImFont::FindGlyph((ImFont *)local_3a8._0_8_,(short)lVar98 + (short)uVar11);
            pvVar55 = local_400;
            if (pGVar66 != (Glyph *)0x0) goto LAB_001502a5;
            lVar74 = *(long *)(puVar59 + 0x18);
            uVar68 = *(ushort *)(lVar74 + lVar85);
          }
          y0_2 = (float)this->TexWidth;
          fStack_3f4 = (float)this->TexHeight;
          uStack_3f0 = 0;
          fVar110 = *(float *)(lVar74 + 8 + lVar85);
          fVar118 = *(float *)(lVar74 + 0xc + lVar85);
          _local_428 = ZEXT416(*(uint *)(lVar74 + 0x14 + lVar85));
          fVar78 = *(float *)(lVar74 + 0x18 + lVar85);
          uVar9 = *(undefined2 *)(lVar74 + 2 + lVar85);
          uVar81 = *(uint *)(lVar74 + 4 + lVar85);
          ImVector<ImFont::Glyph>::resize(this_00,this_00->Size + 1);
          _y0_2 = CONCAT44((float)(int)fStack_3f4,(float)(int)y0_2);
          uStack_3f0 = CONCAT44((float)uStack_3f0._4_4_,(float)(int)uStack_3f0);
          uVar117 = (ushort)(uVar81 >> 0x10);
          auVar37._4_8_ = 0;
          auVar37._0_4_ = uVar81;
          auVar36._12_2_ = uVar117;
          auVar36._0_12_ = auVar37 << 0x20;
          Var32 = CONCAT46(auVar36._10_4_,CONCAT24((short)uVar81,uVar81));
          auVar33._2_10_ = SUB1610(ZEXT616((uint6)((unkuint10)Var32 >> 0x20)) << 0x40,6);
          auVar33._0_2_ = uVar9;
          uVar40 = local_428._0_4_;
          pvVar67 = ImVector<ImFont::Glyph>::back(this_00);
          pvVar67->Codepoint = (short)uVar11 + (short)lVar98;
          auVar113._8_8_ = 0x3f8000003f800000;
          auVar113._0_8_ = 0x3f8000003f800000;
          auVar120._8_8_ = _y0_2;
          auVar120._0_8_ = _y0_2;
          auVar112 = divps(auVar113,auVar120);
          pvVar67->U0 = auVar112._0_4_ * (float)uVar68;
          pvVar67->V0 = auVar112._4_4_ * (float)auVar33._0_4_;
          pvVar67->U1 = auVar112._8_4_ * (float)(int)((unkuint10)Var32 >> 0x20);
          pvVar67->V1 = auVar112._12_4_ * (float)uVar117;
          fVar111 = (float)(int)(*(float *)(local_3a8._0_8_ + 0x60) + fVar109 + 0.5);
          pvVar67->Y1 = fVar78 + 0.0 + fVar111;
          in_XMM2 = ZEXT416((uint)fVar111);
          fVar78 = (local_400->GlyphExtraSpacing).x + *(float *)(lVar80 + 0x10 + lVar85);
          pvVar67->XAdvance = fVar78;
          pvVar67->X0 = fVar110 + 0.0;
          pvVar67->Y0 = fVar111 + fVar118 + 0.0;
          pvVar67->X1 = (float)uVar40 + 0.0;
          puVar59 = local_3b8;
          pvVar55 = local_400;
          if (local_400->PixelSnapH == true) {
            pvVar67->XAdvance = (float)(int)(fVar78 + 0.5);
          }
        }
LAB_001502a5:
        lVar85 = lVar85 + 0x1c;
      }
    }
    ImFont::BuildLookupTable(pvVar55->DstFont);
    uVar79 = local_3c0 + 1;
  }
  ImGui::MemFree(local_398);
  ImGui::MemFree(local_348);
  ImGui::MemFree(local_3e0);
  RenderCustomTexData(this,1,&extra_rects);
  ImVector<stbrp_rect>::~ImVector(&extra_rects);
LAB_00150323:
  return iVar10 <= lVar103;
LAB_0014ed0d:
  if (local_4b0 != (stbtt__point *)0x0) {
    iVar49 = 0;
    for (uVar75 = 0; uVar105 != uVar75; uVar75 = uVar75 + 1) {
      iVar49 = iVar49 + *(int *)((long)pvVar62 + uVar75 * 4);
    }
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + 1;
    p_00 = (stbtt__edge *)(*(pIVar39->IO).MemAllocFn)((long)(iVar49 + 1) * 0x14);
    fVar110 = local_430;
    local_390 = p_00;
    if (p_00 != (stbtt__edge *)0x0) {
      iVar49 = 0;
      iVar82 = 0;
      for (uVar75 = 0; uVar75 != uVar105; uVar75 = uVar75 + 1) {
        iVar50 = *(int *)((long)pvVar62 + uVar75 * 4);
        uVar73 = (ulong)(iVar50 - 1);
        iVar51 = iVar50;
        for (uVar61 = 0; iVar96 = (int)uVar73, (long)uVar61 < (long)iVar51; uVar61 = uVar61 + 1) {
          fVar118 = local_4b0[(long)iVar49 + (long)iVar96].y;
          fVar78 = local_4b0[(long)iVar49 + uVar61].y;
          if ((fVar118 != fVar78) || (NAN(fVar118) || NAN(fVar78))) {
            iVar97 = (int)uVar61;
            iVar51 = iVar96;
            if (fVar118 <= fVar78) {
              iVar51 = iVar97;
              iVar97 = iVar96;
            }
            p_00[iVar82].invert = (uint)(fVar78 < fVar118);
            sVar4 = local_4b0[(long)iVar49 + (long)iVar51];
            sVar5 = local_4b0[(long)iVar49 + (long)iVar97];
            psVar63 = p_00 + iVar82;
            psVar63->x0 = sVar4.x * fVar111 + 0.0;
            psVar63->y0 = sVar4.y * -fVar119 + 0.0;
            psVar63->x1 = sVar5.x * fVar111 + 0.0;
            psVar63->y1 = sVar5.y * -fVar119 + 0.0;
            iVar82 = iVar82 + 1;
            iVar51 = *(int *)((long)pvVar62 + uVar75 * 4);
          }
          uVar73 = uVar61 & 0xffffffff;
        }
        iVar49 = iVar50 + iVar49;
      }
      stbtt__sort_edges_quicksort(p_00,iVar82);
      psVar63 = p_00;
      for (uVar75 = 1; pIVar39 = GImGui, (long)uVar75 < (long)iVar82; uVar75 = uVar75 + 1) {
        uVar2 = p_00[uVar75].x0;
        uVar6 = p_00[uVar75].y0;
        local_230 = p_00[uVar75].invert;
        x0 = (int)p_00[uVar75].x1;
        uStack_234 = p_00[uVar75].y1;
        psVar86 = psVar63;
        for (uVar61 = uVar75; 0 < (long)uVar61; uVar61 = uVar61 - 1) {
          if (psVar86->y0 <= (float)uVar6) goto LAB_0014ef06;
          psVar86[1].invert = psVar86->invert;
          fVar118 = psVar86->y0;
          fVar78 = psVar86->x1;
          fVar111 = psVar86->y1;
          psVar86[1].x0 = psVar86->x0;
          psVar86[1].y0 = fVar118;
          psVar86[1].x1 = fVar78;
          psVar86[1].y1 = fVar111;
          psVar86 = psVar86 + -1;
        }
        uVar61 = 0;
LAB_0014ef06:
        iVar49 = (int)uVar61;
        if (uVar75 != (uVar61 & 0xffffffff)) {
          p_00[iVar49].x0 = (float)uVar2;
          p_00[iVar49].y0 = (float)uVar6;
          p_00[iVar49].x1 = (float)x0;
          p_00[iVar49].y1 = (float)uStack_234;
          p_00[iVar49].invert = local_230;
        }
        psVar63 = psVar63 + 1;
      }
      _y0 = (stbtt__active_edge *)0x0;
      pfVar76 = (float *)&x0;
      if (0x40 < (int)fVar110) {
        piVar1 = &(GImGui->IO).MetricsAllocs;
        *piVar1 = *piVar1 + 1;
        pfVar76 = (float *)(*(pIVar39->IO).MemAllocFn)((ulong)(uint)fVar110 * 8 + 4);
        p_00 = local_390;
        fVar110 = local_430;
      }
      iVar49 = (int)local_338;
      lVar87 = (long)(int)fVar110;
      scanline = pfVar76 + lVar87;
      p_00[iVar82].y0 = (float)((int)local_330 + iVar49) + 1.0;
      local_3c0 = CONCAT44(local_3c0._4_4_,(float)iVar84);
      iVar84 = local_428._0_4_;
      local_3c8 = CONCAT44(local_3c8._4_4_,(float)(int)fVar110);
      fVar118 = 0.0;
      if (0 < (int)fVar110) {
        fVar118 = fVar110;
      }
      local_400 = (value_type *)CONCAT44(local_400._4_4_,fVar118);
      lVar88 = 0;
      if (0 < lVar87) {
        lVar88 = lVar87;
      }
      local_328 = 0;
      local_338 = local_338 & 0xffffffff;
      if (iVar49 < 1) {
        local_338 = 0;
      }
      psVar101 = (stbtt__active_edge *)0x0;
      local_47c = 0;
      local_408 = (undefined8 *)0x0;
      iVar49 = 0;
      uVar75 = local_330;
      while (lVar100 = local_3d0, puVar64 = local_408, iVar49 != (int)local_338) {
        _y0_2 = CONCAT44(fStack_3f4,(float)(int)uVar75);
        fVar118 = (float)(int)uVar75 + 1.0;
        local_330 = uVar75;
        local_318 = iVar49;
        memset(pfVar76,0,lVar87 * 4);
        memset(scanline,0,(long)(iVar84 + 2) << 2);
        fVar110 = y0_2;
        psVar71 = (stbtt__active_edge *)&y0;
        while (psVar70 = psVar71, psVar13 = psVar70->next, psVar13 != (stbtt__active_edge *)0x0) {
          psVar71 = psVar13;
          if (psVar13->ey <= fVar110) {
            psVar70->next = psVar13->next;
            if ((psVar13->direction == 0.0) && (!NAN(psVar13->direction))) {
              __assert_fail("z->direction",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/stb_truetype.h"
                            ,0x83b,
                            "void stbtt__rasterize_sorted_edges(stbtt__bitmap *, stbtt__edge *, int, int, int, int, void *)"
                           );
            }
            psVar13->direction = 0.0;
            psVar13->next = psVar101;
            psVar71 = psVar70;
            psVar101 = psVar13;
          }
        }
        for (; pIVar39 = GImGui, fVar78 = p_00->y0, fVar78 <= fVar118; p_00 = p_00 + 1) {
          fVar111 = p_00->y1;
          if ((fVar78 != fVar111) || (psVar71 = psVar101, NAN(fVar78) || NAN(fVar111))) {
            if (psVar101 == (stbtt__active_edge *)0x0) {
              if (local_47c == 0) {
                piVar1 = &(GImGui->IO).MetricsAllocs;
                *piVar1 = *piVar1 + 1;
                puVar64 = (undefined8 *)(*(pIVar39->IO).MemAllocFn)(0x6408);
                if (puVar64 == (undefined8 *)0x0) goto LAB_00150386;
                *puVar64 = local_408;
                psVar101 = (stbtt__active_edge *)(puVar64 + 0xc7c);
                fVar78 = p_00->y0;
                fVar111 = p_00->y1;
                local_47c = 799;
                psVar71 = (stbtt__active_edge *)0x0;
                local_408 = puVar64;
                fVar110 = y0_2;
              }
              else {
                if (local_408 == (undefined8 *)0x0) {
LAB_00150386:
                  __assert_fail("z != __null",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/stb_truetype.h"
                                ,0x6ab,
                                "stbtt__active_edge *stbtt__new_active(stbtt__hheap *, stbtt__edge *, int, float, void *)"
                               );
                }
                lVar100 = (long)local_47c;
                local_47c = local_47c + -1;
                psVar101 = (stbtt__active_edge *)(local_408 + lVar100 * 4 + -4);
                psVar71 = (stbtt__active_edge *)0x0;
              }
            }
            else {
              psVar71 = psVar101->next;
            }
            fVar119 = p_00->x0;
            fVar133 = (p_00->x1 - fVar119) / (fVar111 - fVar78);
            psVar101->fdx = fVar133;
            psVar101->fdy = (float)(-(uint)(fVar133 != 0.0) & (uint)(1.0 / fVar133));
            psVar101->fx = ((fVar110 - fVar78) * fVar133 + fVar119) - (float)local_3c0;
            psVar101->direction = *(float *)(&DAT_00188a00 + (ulong)(p_00->invert == 0) * 4);
            psVar101->sy = fVar78;
            psVar101->ey = fVar111;
            psVar101->next = (stbtt__active_edge *)0x0;
            if (fVar111 < fVar110) {
              __assert_fail("z->ey >= scan_y_top",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/stb_truetype.h"
                            ,0x848,
                            "void stbtt__rasterize_sorted_edges(stbtt__bitmap *, stbtt__edge *, int, int, int, int, void *)"
                           );
            }
            psVar101->next = _y0;
            _y0 = psVar101;
          }
          psVar101 = psVar71;
        }
        psVar71 = _y0;
        if (_y0 != (stbtt__active_edge *)0x0) {
          for (; psVar71 != (stbtt__active_edge *)0x0; psVar71 = psVar71->next) {
            fVar78 = psVar71->ey;
            if (fVar78 < fVar110) {
              __assert_fail("e->ey >= y_top",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/stb_truetype.h"
                            ,0x77f,
                            "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                           );
            }
            fVar111 = psVar71->fx;
            fVar119 = psVar71->fdx;
            if ((fVar119 != 0.0) || (NAN(fVar119))) {
              fVar133 = psVar71->sy;
              if (fVar118 < fVar133) {
                __assert_fail("e->sy <= y_bottom && e->ey >= y_top",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/stb_truetype.h"
                              ,0x792,
                              "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                             );
              }
              fVar132 = fVar119 + fVar111;
              fVar130 = (float)(~-(uint)(fVar110 < fVar133) & (uint)fVar111 |
                               (uint)((fVar133 - fVar110) * fVar119 + fVar111) &
                               -(uint)(fVar110 < fVar133));
              if ((((fVar130 < 0.0) ||
                   (fVar131 = (float)(~-(uint)(fVar78 < fVar118) & (uint)fVar132 |
                                     (uint)((fVar78 - fVar110) * fVar119 + fVar111) &
                                     -(uint)(fVar78 < fVar118)), fVar131 < 0.0)) ||
                  ((float)local_3c8 <= fVar130)) || ((float)local_3c8 <= fVar131)) {
                local_3a8 = ZEXT416((uint)fVar111);
                _local_428 = ZEXT416((uint)fVar132);
                local_3b8 = (uchar *)CONCAT44(local_3b8._4_4_,fVar119);
                fVar78 = 0.0;
                fVar133 = 0.0;
                iVar49 = 0;
                while (local_400._0_4_ != (float)iVar49) {
                  fVar130 = (float)iVar49;
                  fVar128 = (float)(iVar49 + 1);
                  fVar131 = (fVar130 - fVar111) / fVar119 + fVar110;
                  fVar119 = (fVar128 - fVar111) / fVar119 + fVar110;
                  if ((fVar130 <= fVar111) || (fVar132 <= fVar128)) {
                    if ((fVar130 <= fVar132) || (fVar111 <= fVar128)) {
                      if (((fVar130 <= fVar111) || (fVar132 <= fVar130)) &&
                         ((fVar130 <= fVar132 || (fVar111 <= fVar130)))) {
                        if (((fVar111 < fVar128) && (fVar128 < fVar132)) ||
                           ((fVar132 < fVar128 && (fVar128 < fVar111)))) goto LAB_0014f4d1;
                        auVar124._4_4_ = 0;
                        auVar124._0_4_ = fVar132;
                        auVar124._8_4_ = fVar78;
                        auVar124._12_4_ = fVar133;
                        fVar130 = fVar111;
                        fVar131 = fVar110;
                        goto LAB_0014f583;
                      }
                    }
                    else {
                      stbtt__handle_clipped_edge
                                (pfVar76,iVar49,psVar71,fVar111,fVar110,fVar128,fVar119);
                      fVar111 = fVar128;
                      fVar110 = fVar119;
                    }
                    stbtt__handle_clipped_edge
                              (pfVar76,iVar49,psVar71,fVar111,fVar110,fVar130,fVar131);
                    auVar124 = _local_428;
                  }
                  else {
                    stbtt__handle_clipped_edge
                              (pfVar76,iVar49,psVar71,fVar111,fVar110,fVar130,fVar131);
                    fVar111 = fVar130;
                    fVar110 = fVar131;
LAB_0014f4d1:
                    stbtt__handle_clipped_edge
                              (pfVar76,iVar49,psVar71,fVar111,fVar110,fVar128,fVar119);
                    auVar124 = _local_428;
                    fVar130 = fVar128;
                    fVar131 = fVar119;
                  }
LAB_0014f583:
                  stbtt__handle_clipped_edge
                            (pfVar76,iVar49,psVar71,fVar130,fVar131,auVar124._0_4_,fVar118);
                  fVar111 = (float)local_3a8._0_4_;
                  fVar132 = (float)local_428._0_4_;
                  fVar78 = (float)local_428._8_4_;
                  fVar133 = fStack_41c;
                  iVar49 = iVar49 + 1;
                  fVar119 = local_3b8._0_4_;
                  fVar110 = y0_2;
                }
              }
              else {
                if (fVar133 <= fVar110) {
                  fVar133 = fVar110;
                }
                uVar52 = (uint)fVar130;
                if (fVar118 <= fVar78) {
                  fVar78 = fVar118;
                }
                uVar53 = (uint)fVar131;
                if (uVar52 == uVar53) {
                  if (((int)uVar52 < 0) || ((int)local_430 <= (int)uVar52)) {
                    __assert_fail("x >= 0 && x < len",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/stb_truetype.h"
                                  ,0x7ae,
                                  "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                 );
                  }
                  uVar75 = (ulong)uVar52;
                  pfVar76[uVar75] =
                       (((fVar131 - (float)(int)uVar52) + (fVar130 - (float)(int)uVar52)) * -0.5 +
                       1.0) * psVar71->direction * (fVar78 - fVar133) + pfVar76[uVar75];
                  fVar111 = (fVar78 - fVar133) * psVar71->direction;
                }
                else {
                  fVar119 = psVar71->fdy;
                  uVar54 = uVar52;
                  fVar128 = fVar130;
                  if (fVar131 < fVar130) {
                    fVar128 = fVar110 - fVar133;
                    fVar133 = (fVar110 - fVar78) + fVar118;
                    fVar119 = -fVar119;
                    fVar111 = fVar132;
                    uVar54 = uVar53;
                    uVar53 = uVar52;
                    fVar78 = fVar128 + fVar118;
                    fVar128 = fVar131;
                    fVar131 = fVar130;
                  }
                  iVar49 = uVar54 + 1;
                  fVar132 = ((float)iVar49 - fVar111) * fVar119 + fVar110;
                  fVar111 = psVar71->direction;
                  fVar130 = (fVar132 - fVar133) * fVar111;
                  pfVar76[(int)uVar54] =
                       (1.0 - ((fVar128 - (float)(int)uVar54) + 1.0) * 0.5) * fVar130 +
                       pfVar76[(int)uVar54];
                  uVar75 = (ulong)(int)uVar53;
                  for (lVar100 = (long)iVar49; lVar100 < (long)uVar75; lVar100 = lVar100 + 1) {
                    pfVar76[lVar100] = fVar119 * fVar111 * 0.5 + fVar130 + pfVar76[lVar100];
                    fVar130 = fVar130 + fVar119 * fVar111;
                  }
                  if (1.01 < ABS(fVar130)) {
                    __assert_fail("fabs(area) <= 1.01f",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/stb_truetype.h"
                                  ,0x7d3,
                                  "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                 );
                  }
                  pfVar76[uVar75] =
                       (fVar78 - (fVar119 * (float)(int)(uVar53 - iVar49) + fVar132)) *
                       (((fVar131 - (float)(int)uVar53) + 0.0) * -0.5 + 1.0) * fVar111 + fVar130 +
                       pfVar76[uVar75];
                  fVar111 = (fVar78 - fVar133) * fVar111;
                }
                scanline[uVar75 + 1] = fVar111 + scanline[uVar75 + 1];
              }
            }
            else if (fVar111 < (float)local_3c8) {
              if (0.0 <= fVar111) {
                local_3a8 = ZEXT416((uint)fVar111);
                stbtt__handle_clipped_edge
                          (pfVar76,(int)fVar111,psVar71,fVar111,fVar110,fVar111,fVar118);
                iVar49 = (int)fVar111 + 1;
                auVar112 = local_3a8;
                fVar110 = y0_2;
              }
              else {
                iVar49 = 0;
                auVar112 = ZEXT416((uint)fVar111);
              }
              stbtt__handle_clipped_edge
                        (scanline,iVar49,psVar71,auVar112._0_4_,fVar110,auVar112._0_4_,fVar118);
              fVar110 = y0_2;
            }
          }
        }
        fVar110 = 0.0;
        lVar100 = lVar88;
        pfVar72 = pfVar76;
        uVar75 = local_328;
        while (bVar107 = lVar100 != 0, lVar100 = lVar100 + -1, bVar107) {
          fVar110 = fVar110 + pfVar72[lVar87];
          iVar49 = (int)(ABS(*pfVar72 + fVar110) * 255.0 + 0.5);
          if (0xfe < iVar49) {
            iVar49 = 0xff;
          }
          puVar59[(long)(int)uVar75 + (long)iVar95 + (ulong)uVar125] = (uchar)iVar49;
          uVar75 = (ulong)((int)uVar75 + 1);
          pfVar72 = pfVar72 + 1;
        }
        plVar65 = (long *)&y0;
        while (plVar65 = (long *)*plVar65, plVar65 != (long *)0x0) {
          *(float *)(plVar65 + 1) = *(float *)((long)plVar65 + 0xc) + *(float *)(plVar65 + 1);
        }
        uVar75 = (ulong)((int)local_330 + 1);
        local_328 = (ulong)((int)local_328 + local_3ac);
        iVar49 = local_318 + 1;
      }
      while (pIVar39 = GImGui, puVar64 != (undefined8 *)0x0) {
        puVar14 = (undefined8 *)*puVar64;
        piVar1 = &(GImGui->IO).MetricsAllocs;
        *piVar1 = *piVar1 + -1;
        (*(pIVar39->IO).MemFreeFn)(puVar64);
        puVar64 = puVar14;
      }
      if (pfVar76 != (float *)&x0) {
        ImGui::MemFree(pfVar76);
      }
      pIVar39 = GImGui;
      piVar1 = &(GImGui->IO).MetricsAllocs;
      *piVar1 = *piVar1 + -1;
      (*(pIVar39->IO).MemFreeFn)(local_390);
    }
    pIVar39 = GImGui;
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + -1;
    (*(pIVar39->IO).MemFreeFn)(pvVar62);
    pIVar39 = GImGui;
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + -1;
    (*(pIVar39->IO).MemFreeFn)(local_4b0);
  }
LAB_0014f933:
  ImGui::MemFree((void *)CONCAT44(uStack_384,x1));
  uVar54 = local_380.h_oversample;
  uVar61 = local_380._32_8_ & 0xffffffff;
  uVar53 = *(uint *)(lVar100 + 8);
  uVar52 = *(uint *)(lVar100 + 4);
  if (1 < uVar61) {
    lVar88 = (long)local_380.stride_in_bytes;
    lVar87 = (long)(int)((uVar53 >> 0x10) * local_380.stride_in_bytes);
    puVar59 = local_380.pixels + lVar87 + (ulong)(ushort)uVar53;
    iVar84 = (uVar52 & 0xffff) - local_380.h_oversample;
    _x0 = 0;
    if (iVar84 < 0) {
      iVar84 = -1;
    }
    uVar75 = (long)iVar84 + 1;
    puVar83 = local_380.pixels + lVar87 + (ulong)(ushort)uVar53 + (long)iVar84 + 1;
    for (uVar53 = 0; uVar53 != uVar52 >> 0x10; uVar53 = uVar53 + 1) {
      memset(&x0,0,uVar61);
      puVar90 = puVar83;
      uVar105 = uVar75;
      switch(uVar54) {
      case 2:
        uVar73 = 0;
        for (uVar89 = 0; uVar75 != uVar89; uVar89 = uVar89 + 1) {
          bVar108 = puVar59[uVar89];
          bVar8 = *(byte *)((long)&x0 + (ulong)((uint)uVar89 & 7));
          *(byte *)((long)&x0 + (ulong)((uint)uVar89 + 2 & 7)) = bVar108;
          uVar69 = (int)uVar73 + ((uint)bVar108 - (uint)bVar8);
          uVar73 = (ulong)uVar69;
          puVar59[uVar89] = (uchar)(uVar69 >> 1);
        }
        break;
      case 3:
        uVar73 = 0;
        for (uVar89 = 0; uVar75 != uVar89; uVar89 = uVar89 + 1) {
          bVar108 = puVar59[uVar89];
          bVar8 = *(byte *)((long)&x0 + (ulong)((uint)uVar89 & 7));
          *(byte *)((long)&x0 + (ulong)((uint)uVar89 + 3 & 7)) = bVar108;
          uVar73 = (ulong)((int)uVar73 + ((uint)bVar108 - (uint)bVar8));
          puVar59[uVar89] = (uchar)(uVar73 / 3);
        }
        break;
      case 4:
        uVar73 = 0;
        for (uVar89 = 0; uVar75 != uVar89; uVar89 = uVar89 + 1) {
          bVar108 = puVar59[uVar89];
          uVar91 = (ulong)((uint)uVar89 & 7);
          *(byte *)((long)&x0 + (uVar91 ^ 4)) = bVar108;
          uVar69 = (int)uVar73 + ((uint)bVar108 - (uint)*(byte *)((long)&x0 + uVar91));
          uVar73 = (ulong)uVar69;
          puVar59[uVar89] = (uchar)(uVar69 >> 2);
        }
        break;
      case 5:
        uVar73 = 0;
        for (uVar89 = 0; uVar75 != uVar89; uVar89 = uVar89 + 1) {
          bVar108 = puVar59[uVar89];
          bVar8 = *(byte *)((long)&x0 + (ulong)((uint)uVar89 & 7));
          *(byte *)((long)&x0 + (ulong)((uint)uVar89 + 5 & 7)) = bVar108;
          uVar73 = (ulong)((int)uVar73 + ((uint)bVar108 - (uint)bVar8));
          puVar59[uVar89] = (uchar)(uVar73 / 5);
        }
        break;
      default:
        uVar73 = 0;
        for (uVar89 = 0; uVar75 != uVar89; uVar89 = uVar89 + 1) {
          bVar108 = puVar59[uVar89];
          bVar8 = *(byte *)((long)&x0 + (ulong)((uint)uVar89 & 7));
          *(byte *)((long)&x0 + (ulong)(uVar54 + (uint)uVar89 & 7)) = bVar108;
          uVar69 = (int)uVar73 + ((uint)bVar108 - (uint)bVar8);
          uVar73 = (ulong)uVar69;
          puVar59[uVar89] = (uchar)(uVar69 / uVar54);
        }
      }
      for (; uVar105 < (uVar52 & 0xffff); uVar105 = uVar105 + 1) {
        if (*puVar90 != '\0') {
          __assert_fail("pixels[i] == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/stb_truetype.h"
                        ,0xada,
                        "void stbtt__h_prefilter(unsigned char *, int, int, int, unsigned int)");
        }
        uVar69 = (int)uVar73 - (uint)*(byte *)((long)&x0 + (ulong)((uint)uVar105 & 7));
        uVar73 = (ulong)uVar69;
        *puVar90 = (uchar)(uVar69 / uVar54);
        puVar90 = puVar90 + 1;
      }
      puVar59 = puVar59 + lVar88;
      puVar83 = puVar83 + lVar88;
    }
    uVar53 = *(uint *)(local_3d0 + 8);
    uVar52 = *(uint *)(local_3d0 + 4);
  }
  uVar54 = local_380.v_oversample;
  uVar75 = (ulong)local_380.v_oversample;
  if (1 < uVar75) {
    lVar88 = (long)local_380.stride_in_bytes;
    lVar87 = (long)(int)((uVar53 >> 0x10) * local_380.stride_in_bytes);
    pbVar102 = local_380.pixels + lVar87 + (ulong)(ushort)uVar53;
    uVar68 = (ushort)(uVar52 >> 0x10);
    _x0 = 0;
    iVar84 = uVar68 - local_380.v_oversample;
    if (iVar84 < 0) {
      iVar84 = -1;
    }
    uVar105 = (long)iVar84 + 1;
    puVar59 = local_380.pixels + uVar105 * lVar88 + lVar87 + (ulong)(ushort)uVar53;
    for (uVar53 = 0; uVar53 != (uVar52 & 0xffff); uVar53 = uVar53 + 1) {
      memset(&x0,0,uVar75);
      puVar83 = puVar59;
      uVar73 = uVar105;
      switch(uVar54) {
      case 2:
        uVar89 = 0;
        pbVar93 = pbVar102;
        for (uVar91 = 0; uVar105 != uVar91; uVar91 = uVar91 + 1) {
          bVar108 = *pbVar93;
          bVar8 = *(byte *)((long)&x0 + (ulong)((uint)uVar91 & 7));
          *(byte *)((long)&x0 + (ulong)((uint)uVar91 + 2 & 7)) = bVar108;
          uVar69 = (int)uVar89 + ((uint)bVar108 - (uint)bVar8);
          uVar89 = (ulong)uVar69;
          *pbVar93 = (byte)(uVar69 >> 1);
          pbVar93 = pbVar93 + lVar88;
        }
        break;
      case 3:
        uVar89 = 0;
        pbVar93 = pbVar102;
        for (uVar91 = 0; uVar105 != uVar91; uVar91 = uVar91 + 1) {
          bVar108 = *pbVar93;
          bVar8 = *(byte *)((long)&x0 + (ulong)((uint)uVar91 & 7));
          *(byte *)((long)&x0 + (ulong)((uint)uVar91 + 3 & 7)) = bVar108;
          uVar89 = (ulong)((int)uVar89 + ((uint)bVar108 - (uint)bVar8));
          *pbVar93 = (byte)(uVar89 / 3);
          pbVar93 = pbVar93 + lVar88;
        }
        break;
      case 4:
        uVar89 = 0;
        pbVar93 = pbVar102;
        for (uVar91 = 0; uVar105 != uVar91; uVar91 = uVar91 + 1) {
          bVar108 = *pbVar93;
          uVar92 = (ulong)((uint)uVar91 & 7);
          *(byte *)((long)&x0 + (uVar92 ^ 4)) = bVar108;
          uVar69 = (int)uVar89 + ((uint)bVar108 - (uint)*(byte *)((long)&x0 + uVar92));
          uVar89 = (ulong)uVar69;
          *pbVar93 = (byte)(uVar69 >> 2);
          pbVar93 = pbVar93 + lVar88;
        }
        break;
      case 5:
        uVar89 = 0;
        pbVar93 = pbVar102;
        for (uVar91 = 0; uVar105 != uVar91; uVar91 = uVar91 + 1) {
          bVar108 = *pbVar93;
          bVar8 = *(byte *)((long)&x0 + (ulong)((uint)uVar91 & 7));
          *(byte *)((long)&x0 + (ulong)((uint)uVar91 + 5 & 7)) = bVar108;
          uVar89 = (ulong)((int)uVar89 + ((uint)bVar108 - (uint)bVar8));
          *pbVar93 = (byte)(uVar89 / 5);
          pbVar93 = pbVar93 + lVar88;
        }
        break;
      default:
        uVar89 = 0;
        pbVar93 = pbVar102;
        for (uVar91 = 0; uVar105 != uVar91; uVar91 = uVar91 + 1) {
          bVar108 = *pbVar93;
          bVar8 = *(byte *)((long)&x0 + (ulong)((uint)uVar91 & 7));
          *(byte *)((long)&x0 + (ulong)(uVar54 + (uint)uVar91 & 7)) = bVar108;
          uVar69 = (int)uVar89 + ((uint)bVar108 - (uint)bVar8);
          uVar89 = (ulong)uVar69;
          *pbVar93 = (byte)(uVar69 / uVar54);
          pbVar93 = pbVar93 + lVar88;
        }
      }
      for (; uVar73 < uVar68; uVar73 = uVar73 + 1) {
        if (*puVar83 != '\0') {
          __assert_fail("pixels[i*stride_in_bytes] == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/stb_truetype.h"
                        ,0xb18,
                        "void stbtt__v_prefilter(unsigned char *, int, int, int, unsigned int)");
        }
        uVar69 = (int)uVar89 - (uint)*(byte *)((long)&x0 + (ulong)((uint)uVar73 & 7));
        uVar89 = (ulong)uVar69;
        *puVar83 = (uchar)(uVar69 / uVar54);
        puVar83 = puVar83 + lVar88;
      }
      pbVar102 = pbVar102 + 1;
      puVar59 = puVar59 + 1;
    }
    uVar53 = *(uint *)(local_3d0 + 8);
    uVar52 = *(uint *)(local_3d0 + 4);
  }
  *puVar60 = uVar53;
  uVar68 = (ushort)(uVar52 >> 0x10);
  puVar60[1] = CONCAT22((short)(uVar53 >> 0x10) + uVar68,(short)uVar53 + (short)uVar52);
  puVar60[4] = (uint)((float)(int)(short)((short)(local_31c << 8) + (short)local_320) * fVar109);
  in_XMM2._4_4_ = (float)y0_1;
  in_XMM2._0_4_ = (float)x0_1;
  in_XMM2._8_8_ = 0;
  *(ulong *)(puVar60 + 2) =
       CONCAT44((float)y0_1 * local_258._4_4_ + local_248._4_4_,
                (float)x0_1 * local_258._0_4_ + local_248._0_4_);
  puVar60[5] = (uint)((float)(int)((uVar52 & 0xffff) + x0_1) * local_258._0_4_ + local_248._0_4_);
  puVar60[6] = (uint)((float)(int)((uint)uVar68 + y0_1) * local_258._4_4_ + local_248._4_4_);
LAB_0014fea4:
  lVar80 = lVar80 + 1;
  lVar74 = lVar74 + 1;
  goto LAB_0014e8ba;
}

Assistant:

bool    ImFontAtlas::Build()
{
    IM_ASSERT(ConfigData.Size > 0);

    TexID = NULL;
    TexWidth = TexHeight = 0;
    TexUvWhitePixel = ImVec2(0, 0);
    ClearTexData();

    struct ImFontTempBuildData
    {
        stbtt_fontinfo      FontInfo;
        stbrp_rect*         Rects;
        stbtt_pack_range*   Ranges;
        int                 RangesCount;
    };
    ImFontTempBuildData* tmp_array = (ImFontTempBuildData*)ImGui::MemAlloc((size_t)ConfigData.Size * sizeof(ImFontTempBuildData));

    // Initialize font information early (so we can error without any cleanup) + count glyphs
    int total_glyph_count = 0;
    int total_glyph_range_count = 0;
    for (int input_i = 0; input_i < ConfigData.Size; input_i++)
    {
        ImFontConfig& cfg = ConfigData[input_i];
        ImFontTempBuildData& tmp = tmp_array[input_i];

        IM_ASSERT(cfg.DstFont && (!cfg.DstFont->IsLoaded() || cfg.DstFont->ContainerAtlas == this));
        const int font_offset = stbtt_GetFontOffsetForIndex((unsigned char*)cfg.FontData, cfg.FontNo);
        IM_ASSERT(font_offset >= 0);
        if (!stbtt_InitFont(&tmp.FontInfo, (unsigned char*)cfg.FontData, font_offset))
            return false;

        // Count glyphs
        if (!cfg.GlyphRanges)
            cfg.GlyphRanges = GetGlyphRangesDefault();
        for (const ImWchar* in_range = cfg.GlyphRanges; in_range[0] && in_range[1]; in_range += 2)
        {
            total_glyph_count += (in_range[1] - in_range[0]) + 1;
            total_glyph_range_count++;
        }
    }

    // Start packing. We need a known width for the skyline algorithm. Using a cheap heuristic here to decide of width. User can override TexDesiredWidth if they wish.
    // After packing is done, width shouldn't matter much, but some API/GPU have texture size limitations and increasing width can decrease height.
    TexWidth = (TexDesiredWidth > 0) ? TexDesiredWidth : (total_glyph_count > 4000) ? 4096 : (total_glyph_count > 2000) ? 2048 : (total_glyph_count > 1000) ? 1024 : 512;
    TexHeight = 0;
    const int max_tex_height = 1024*32;
    stbtt_pack_context spc;
    stbtt_PackBegin(&spc, NULL, TexWidth, max_tex_height, 0, 1, NULL);

    // Pack our extra data rectangles first, so it will be on the upper-left corner of our texture (UV will have small values).
    ImVector<stbrp_rect> extra_rects;
    RenderCustomTexData(0, &extra_rects);
    stbtt_PackSetOversampling(&spc, 1, 1);
    stbrp_pack_rects((stbrp_context*)spc.pack_info, &extra_rects[0], extra_rects.Size);
    for (int i = 0; i < extra_rects.Size; i++)
        if (extra_rects[i].was_packed)
            TexHeight = ImMax(TexHeight, extra_rects[i].y + extra_rects[i].h);

    // Allocate packing character data and flag packed characters buffer as non-packed (x0=y0=x1=y1=0)
    int buf_packedchars_n = 0, buf_rects_n = 0, buf_ranges_n = 0;
    stbtt_packedchar* buf_packedchars = (stbtt_packedchar*)ImGui::MemAlloc(total_glyph_count * sizeof(stbtt_packedchar));
    stbrp_rect* buf_rects = (stbrp_rect*)ImGui::MemAlloc(total_glyph_count * sizeof(stbrp_rect));
    stbtt_pack_range* buf_ranges = (stbtt_pack_range*)ImGui::MemAlloc(total_glyph_range_count * sizeof(stbtt_pack_range));
    memset(buf_packedchars, 0, total_glyph_count * sizeof(stbtt_packedchar));
    memset(buf_rects, 0, total_glyph_count * sizeof(stbrp_rect));              // Unnecessary but let's clear this for the sake of sanity.
    memset(buf_ranges, 0, total_glyph_range_count * sizeof(stbtt_pack_range));

    // First font pass: pack all glyphs (no rendering at this point, we are working with rectangles in an infinitely tall texture at this point)
    for (int input_i = 0; input_i < ConfigData.Size; input_i++)
    {
        ImFontConfig& cfg = ConfigData[input_i];
        ImFontTempBuildData& tmp = tmp_array[input_i];

        // Setup ranges
        int glyph_count = 0;
        int glyph_ranges_count = 0;
        for (const ImWchar* in_range = cfg.GlyphRanges; in_range[0] && in_range[1]; in_range += 2)
        {
            glyph_count += (in_range[1] - in_range[0]) + 1;
            glyph_ranges_count++;
        }
        tmp.Ranges = buf_ranges + buf_ranges_n;
        tmp.RangesCount = glyph_ranges_count;
        buf_ranges_n += glyph_ranges_count;
        for (int i = 0; i < glyph_ranges_count; i++)
        {
            const ImWchar* in_range = &cfg.GlyphRanges[i * 2];
            stbtt_pack_range& range = tmp.Ranges[i];
            range.font_size = cfg.SizePixels;
            range.first_unicode_codepoint_in_range = in_range[0];
            range.num_chars = (in_range[1] - in_range[0]) + 1;
            range.chardata_for_range = buf_packedchars + buf_packedchars_n;
            buf_packedchars_n += range.num_chars;
        }

        // Pack
        tmp.Rects = buf_rects + buf_rects_n;
        buf_rects_n += glyph_count;
        stbtt_PackSetOversampling(&spc, cfg.OversampleH, cfg.OversampleV);
        int n = stbtt_PackFontRangesGatherRects(&spc, &tmp.FontInfo, tmp.Ranges, tmp.RangesCount, tmp.Rects);
        stbrp_pack_rects((stbrp_context*)spc.pack_info, tmp.Rects, n);

        // Extend texture height
        for (int i = 0; i < n; i++)
            if (tmp.Rects[i].was_packed)
                TexHeight = ImMax(TexHeight, tmp.Rects[i].y + tmp.Rects[i].h);
    }
    IM_ASSERT(buf_rects_n == total_glyph_count);
    IM_ASSERT(buf_packedchars_n == total_glyph_count);
    IM_ASSERT(buf_ranges_n == total_glyph_range_count);

    // Create texture
    TexHeight = ImUpperPowerOfTwo(TexHeight);
    TexPixelsAlpha8 = (unsigned char*)ImGui::MemAlloc(TexWidth * TexHeight);
    memset(TexPixelsAlpha8, 0, TexWidth * TexHeight);
    spc.pixels = TexPixelsAlpha8;
    spc.height = TexHeight;

    // Second pass: render characters
    for (int input_i = 0; input_i < ConfigData.Size; input_i++)
    {
        ImFontConfig& cfg = ConfigData[input_i];
        ImFontTempBuildData& tmp = tmp_array[input_i];
        stbtt_PackSetOversampling(&spc, cfg.OversampleH, cfg.OversampleV);
        stbtt_PackFontRangesRenderIntoRects(&spc, &tmp.FontInfo, tmp.Ranges, tmp.RangesCount, tmp.Rects);
        tmp.Rects = NULL;
    }

    // End packing
    stbtt_PackEnd(&spc);
    ImGui::MemFree(buf_rects);
    buf_rects = NULL;

    // Third pass: setup ImFont and glyphs for runtime
    for (int input_i = 0; input_i < ConfigData.Size; input_i++)
    {
        ImFontConfig& cfg = ConfigData[input_i];
        ImFontTempBuildData& tmp = tmp_array[input_i];
        ImFont* dst_font = cfg.DstFont;

        float font_scale = stbtt_ScaleForPixelHeight(&tmp.FontInfo, cfg.SizePixels);
        int unscaled_ascent, unscaled_descent, unscaled_line_gap;
        stbtt_GetFontVMetrics(&tmp.FontInfo, &unscaled_ascent, &unscaled_descent, &unscaled_line_gap);

        float ascent = unscaled_ascent * font_scale;
        float descent = unscaled_descent * font_scale;
        if (!cfg.MergeMode)
        {
            dst_font->ContainerAtlas = this;
            dst_font->ConfigData = &cfg;
            dst_font->ConfigDataCount = 0;
            dst_font->FontSize = cfg.SizePixels;
            dst_font->Ascent = ascent;
            dst_font->Descent = descent;
            dst_font->Glyphs.resize(0);
        }
        dst_font->ConfigDataCount++;
        float off_y = (cfg.MergeMode && cfg.MergeGlyphCenterV) ? (ascent - dst_font->Ascent) * 0.5f : 0.0f;

        dst_font->FallbackGlyph = NULL; // Always clear fallback so FindGlyph can return NULL. It will be set again in BuildLookupTable()
        for (int i = 0; i < tmp.RangesCount; i++)
        {
            stbtt_pack_range& range = tmp.Ranges[i];
            for (int char_idx = 0; char_idx < range.num_chars; char_idx += 1)
            {
                const stbtt_packedchar& pc = range.chardata_for_range[char_idx];
                if (!pc.x0 && !pc.x1 && !pc.y0 && !pc.y1)
                    continue;

                const int codepoint = range.first_unicode_codepoint_in_range + char_idx;
                if (cfg.MergeMode && dst_font->FindGlyph((unsigned short)codepoint))
                    continue;

                stbtt_aligned_quad q;
                float dummy_x = 0.0f, dummy_y = 0.0f;
                stbtt_GetPackedQuad(range.chardata_for_range, TexWidth, TexHeight, char_idx, &dummy_x, &dummy_y, &q, 0);

                dst_font->Glyphs.resize(dst_font->Glyphs.Size + 1);
                ImFont::Glyph& glyph = dst_font->Glyphs.back();
                glyph.Codepoint = (ImWchar)codepoint;
                glyph.X0 = q.x0; glyph.Y0 = q.y0; glyph.X1 = q.x1; glyph.Y1 = q.y1;
                glyph.U0 = q.s0; glyph.V0 = q.t0; glyph.U1 = q.s1; glyph.V1 = q.t1;
                glyph.Y0 += (float)(int)(dst_font->Ascent + off_y + 0.5f);
                glyph.Y1 += (float)(int)(dst_font->Ascent + off_y + 0.5f);
                glyph.XAdvance = (pc.xadvance + cfg.GlyphExtraSpacing.x);  // Bake spacing into XAdvance
                if (cfg.PixelSnapH)
                    glyph.XAdvance = (float)(int)(glyph.XAdvance + 0.5f);
            }
        }
        cfg.DstFont->BuildLookupTable();
    }

    // Cleanup temporaries
    ImGui::MemFree(buf_packedchars);
    ImGui::MemFree(buf_ranges);
    ImGui::MemFree(tmp_array);

    // Render into our custom data block
    RenderCustomTexData(1, &extra_rects);

    return true;
}